

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O2

void __thiscall QDockWidgetPrivate::startDrag(QDockWidgetPrivate *this,DragScope scope)

{
  uint uVar1;
  bool bVar2;
  DropAction DVar3;
  QMainWindowLayout *this_00;
  QLayoutItem *pQVar4;
  QDockWidgetGroupWindow *pQVar5;
  DragState *pDVar6;
  undefined **ppuVar7;
  QDockWidgetGroupWindow *widget;
  
  if ((this->state != (DragState *)0x0) && (this->state->dragging == false)) {
    widget = *(QDockWidgetGroupWindow **)&(this->super_QWidgetPrivate).field_0x8;
    this_00 = qt_mainwindow_layout_from_dock((QDockWidget *)widget);
    uVar1 = (((widget->super_QWidget).data)->window_flags).
            super_QFlagsStorageHelper<Qt::WindowType,_4>.super_QFlagsStorage<Qt::WindowType>.i;
    pQVar4 = QMainWindowLayout::unplug((QMainWindowLayout *)this_00,&widget->super_QWidget,scope);
    pDVar6 = this->state;
    pDVar6->widgetItem = pQVar4;
    if (pQVar4 == (QLayoutItem *)0x0) {
      pQVar5 = QtPrivate::qobject_cast_helper<QDockWidgetGroupWindow*,QObject>
                         (*(QObject **)&(this->super_QWidgetPrivate).field_0x10);
      if ((pQVar5 == (QDockWidgetGroupWindow *)0x0) ||
         (((((widget->super_QWidget).data)->window_flags).
           super_QFlagsStorageHelper<Qt::WindowType,_4>.super_QFlagsStorage<Qt::WindowType>.i & 1)
          != 0)) {
        ppuVar7 = &PTR__QWidgetItem_007cc378;
      }
      else {
        ppuVar7 = &PTR__QWidgetItem_007cbf10;
        widget = pQVar5;
      }
      pQVar4 = (QLayoutItem *)operator_new(0x18);
      (pQVar4->align).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
      super_QFlagsStorage<Qt::AlignmentFlag>.i = 0;
      pQVar4[1]._vptr_QLayoutItem = (_func_int **)widget;
      pQVar4->_vptr_QLayoutItem = (_func_int **)ppuVar7;
      pDVar6 = this->state;
      pDVar6->widgetItem = pQVar4;
      pDVar6->ownWidgetItem = true;
    }
    if (pDVar6->ctrlDrag == true) {
      QMainWindowLayout::restore((QMainWindowLayout *)this_00,false);
      pDVar6 = this->state;
    }
    pDVar6->dragging = true;
    bVar2 = QMainWindowLayout::needsPlatformDrag();
    if (bVar2) {
      DVar3 = QMainWindowLayout::performPlatformWidgetDrag
                        ((QMainWindowLayout *)this_00,this->state->widgetItem,&this->state->pressPos
                        );
      if (DVar3 != IgnoreAction || (uVar1 & 1) != 0) {
        endDrag(this,LocationChange);
        return;
      }
      QMainWindowLayout::revert((QMainWindowLayout *)this_00,this->state->widgetItem);
      operator_delete(this->state,0x30);
      this->state = (DragState *)0x0;
    }
  }
  return;
}

Assistant:

void QDockWidgetPrivate::startDrag(DragScope scope)
{
    Q_Q(QDockWidget);

    if (state == nullptr || state->dragging)
        return;

    QMainWindowLayout *layout = qt_mainwindow_layout_from_dock(q);
    Q_ASSERT(layout != nullptr);

#if QT_CONFIG(draganddrop)
    bool wasFloating = q->isFloating();
#endif

    state->widgetItem = layout->unplug(q, scope);
    if (state->widgetItem == nullptr) {
        /*  Dock widget has a QMainWindow parent, but was never inserted with
            QMainWindow::addDockWidget, so the QMainWindowLayout has no
            widget item for it. It will be newly created and deleted if it doesn't
            get dropped into a dock area. */
        QDockWidgetGroupWindow *floatingTab = qobject_cast<QDockWidgetGroupWindow*>(parent);
        if (floatingTab && !q->isFloating())
            state->widgetItem = new QDockWidgetGroupWindowItem(floatingTab);
        else
            state->widgetItem = new QDockWidgetItem(q);
        state->ownWidgetItem = true;
    }

    if (state->ctrlDrag)
        layout->restore();

    state->dragging = true;

#if QT_CONFIG(draganddrop)
    if (QMainWindowLayout::needsPlatformDrag()) {
        Qt::DropAction result =
                layout->performPlatformWidgetDrag(state->widgetItem, state->pressPos);
        if (result == Qt::IgnoreAction && !wasFloating) {
            layout->revert(state->widgetItem);
            delete state;
            state = nullptr;
        } else {
            endDrag(QDockWidgetPrivate::EndDragMode::LocationChange);
        }
    }
#endif
}